

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall ECDSAAdaptor_Sign_Test::TestBody(ECDSAAdaptor_Sign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_100;
  Message local_f8;
  ByteData local_f0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0 [3];
  ByteData local_88;
  string local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  AdaptorPair adaptor_pair;
  ECDSAAdaptor_Sign_Test *this_local;
  
  adaptor_pair.proof.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::AdaptorUtil::Sign((AdaptorPair *)&gtest_ar.message_,&::msg,&::sk,&adaptor);
  cfd::core::AdaptorSignature::GetData(&local_88,(AdaptorSignature *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_70,&local_88);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_50,"adaptor_sig_str",
             "adaptor_pair.signature.GetData().GetHex()",&adaptor_sig_str_abi_cxx11_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cfd::core::ByteData::~ByteData(&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  cfd::core::AdaptorProof::GetData
            (&local_f0,
             (AdaptorProof *)
             ((long)&adaptor_pair.signature.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d8,&local_f0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_b8,"adaptor_proof_str","adaptor_pair.proof.GetData().GetHex()"
             ,&adaptor_proof_str_abi_cxx11_,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cfd::core::ByteData::~ByteData(&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  cfd::core::AdaptorPair::~AdaptorPair((AdaptorPair *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ECDSAAdaptor, Sign) {
  auto adaptor_pair = AdaptorUtil::Sign(msg, sk, adaptor);

  EXPECT_EQ(adaptor_sig_str, adaptor_pair.signature.GetData().GetHex());
  EXPECT_EQ(adaptor_proof_str, adaptor_pair.proof.GetData().GetHex());
}